

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall
DomPropertySpecifications::write(DomPropertySpecifications *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  DomPropertyToolTip **ppDVar2;
  DomStringPropertySpecification **ppDVar3;
  size_t sVar4;
  undefined4 in_register_00000034;
  QAnyStringView *str_00;
  long in_FS_OFFSET;
  DomStringPropertySpecification *v_1;
  QList<DomStringPropertySpecification_*> *__range1_1;
  DomPropertyToolTip *v;
  QList<DomPropertyToolTip_*> *__range1;
  char16_t *str;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  DataPointer *in_stack_fffffffffffffec8;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffed0;
  DomStringPropertySpecification *this_00;
  QString *in_stack_fffffffffffffed8;
  QAnyStringView *pQVar5;
  DomPropertyToolTip *in_stack_fffffffffffffee0;
  QAnyStringView *in_stack_fffffffffffffee8;
  undefined1 local_a8 [24];
  DomStringPropertySpecification **local_90;
  const_iterator local_88;
  const_iterator local_80;
  undefined1 local_78 [24];
  DomPropertyToolTip **local_60;
  const_iterator local_58;
  const_iterator local_50;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  str_00 = (QAnyStringView *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x1ad159);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (local_48,(Data *)0x0,L"propertyspecifications",0x16);
    QString::QString((QString *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  else {
    QString::toLower((QString *)in_stack_fffffffffffffec8);
  }
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  QXmlStreamWriter::writeStartElement(str_00);
  QString::~QString((QString *)0x1ad215);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffed0);
  }
  sVar4 = 0xaaaaaaaaaaaaaaaa;
  local_50.i = (DomPropertyToolTip **)0xaaaaaaaaaaaaaaaa;
  local_50 = QList<DomPropertyToolTip_*>::begin
                       ((QList<DomPropertyToolTip_*> *)in_stack_fffffffffffffed0);
  local_58.i = (DomPropertyToolTip **)0xaaaaaaaaaaaaaaaa;
  local_58 = QList<DomPropertyToolTip_*>::end
                       ((QList<DomPropertyToolTip_*> *)in_stack_fffffffffffffed0);
  while( true ) {
    local_60 = local_58.i;
    bVar1 = QList<DomPropertyToolTip_*>::const_iterator::operator!=(&local_50,local_58);
    if (!bVar1) break;
    ppDVar2 = QList<DomPropertyToolTip_*>::const_iterator::operator*(&local_50);
    in_stack_fffffffffffffee0 = *ppDVar2;
    in_stack_fffffffffffffee8 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)str_00,(size_t)in_stack_fffffffffffffee0);
    DomPropertyToolTip::write
              (in_stack_fffffffffffffee0,(int)in_stack_fffffffffffffee8,local_78,sVar4);
    QString::~QString((QString *)0x1ad31b);
    QList<DomPropertyToolTip_*>::const_iterator::operator++(&local_50);
  }
  sVar4 = 0xaaaaaaaaaaaaaaaa;
  local_80.i = (DomStringPropertySpecification **)0xaaaaaaaaaaaaaaaa;
  local_80 = QList<DomStringPropertySpecification_*>::begin
                       ((QList<DomStringPropertySpecification_*> *)in_stack_fffffffffffffed0);
  local_88.i = (DomStringPropertySpecification **)0xaaaaaaaaaaaaaaaa;
  local_88 = QList<DomStringPropertySpecification_*>::end
                       ((QList<DomStringPropertySpecification_*> *)in_stack_fffffffffffffed0);
  while( true ) {
    local_90 = local_88.i;
    bVar1 = QList<DomStringPropertySpecification_*>::const_iterator::operator!=(&local_80,local_88);
    if (!bVar1) break;
    ppDVar3 = QList<DomStringPropertySpecification_*>::const_iterator::operator*(&local_80);
    this_00 = *ppDVar3;
    pQVar5 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0);
    DomStringPropertySpecification::write(this_00,(int)pQVar5,local_a8,sVar4);
    QString::~QString((QString *)0x1ad41d);
    QList<DomStringPropertySpecification_*>::const_iterator::operator++(&local_80);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomPropertySpecifications::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("propertyspecifications") : tagName.toLower());

    for (DomPropertyToolTip *v : m_tooltip)
        v->write(writer, u"tooltip"_s);

    for (DomStringPropertySpecification *v : m_stringpropertyspecification)
        v->write(writer, u"stringpropertyspecification"_s);

    writer.writeEndElement();
}